

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  upb_tabent *puVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  upb_strtable new_table;
  upb_strtable local_48;
  
  iVar5 = init((EVP_PKEY_CTX *)&local_48);
  if (SUB41(iVar5,0) != false) {
    bVar6 = (t->t).size_lg2;
    if (bVar6 != 0) {
      uVar7 = 0xffffffffffffffff;
      do {
        lVar4 = uVar7 * 0x18;
        do {
          lVar3 = lVar4;
          uVar7 = uVar7 + 1;
          if ((ulong)(long)(1 << (bVar6 & 0x1f)) <= uVar7) goto LAB_00122013;
          puVar1 = (t->t).entries;
          puVar2 = *(uint **)((long)&puVar1[1].key + lVar3);
          lVar4 = lVar3 + 0x18;
        } while (puVar2 == (uint *)0x0);
        upb_strtable_insert(&local_48,(char *)(puVar2 + 1),(ulong)*puVar2,
                            (upb_value)*(uint64_t *)((long)&puVar1[1].val.val + lVar3),a);
        bVar6 = (t->t).size_lg2;
      } while (bVar6 != 0);
    }
LAB_00122013:
    (t->t).size_lg2 = local_48.t.size_lg2;
    *(undefined7 *)&(t->t).field_0x11 = local_48.t._17_7_;
    (t->t).entries = local_48.t.entries;
    (t->t).count = local_48.t.count;
    (t->t).mask = local_48.t.mask;
    (t->t).max_count = local_48.t.max_count;
  }
  return SUB41(iVar5,0);
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView key;
  upb_value val;
  while (upb_strtable_next2(t, &key, &val, &iter)) {
    upb_strtable_insert(&new_table, key.data, key.size, val, a);
  }
  *t = new_table;
  return true;
}